

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareRootUnscentedKalmanFilter.cpp
# Opt level: O0

void __thiscall
SquareRootUnscentedKalmanFilter_init_Test::TestBody(SquareRootUnscentedKalmanFilter_init_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_260;
  AssertHelper local_240;
  Message local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__1;
  SquareRootUnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> ukfMatrix;
  AssertHelper local_120;
  Message local_118 [3];
  undefined1 local_100 [8];
  AssertionResult gtest_ar_;
  SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  SquareRootUnscentedKalmanFilter_init_Test *this_local;
  
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._40_8_ = this;
  Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
  SquareRootUnscentedKalmanFilter
            ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)
             ((long)&gtest_ar_.message_.ptr_ + 4),1.0,2.0,1.0);
  bVar1 = Kalman::Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::isIdentity
                    ((Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                     &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_100,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
                super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info,(internal *)local_100,
               (AssertionResult *)"ukf.S.isIdentity()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
               ,0xe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string
              ((string *)
               &ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
                super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info);
    testing::Message::~Message(local_118);
  }
  ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
  super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._41_3_ = 0;
  ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
  super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  if (ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
      super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
      super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._40_4_ == 0) {
    Kalman::SquareRootUnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::
    SquareRootUnscentedKalmanFilter
              ((SquareRootUnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
               &gtest_ar__1.message_,1.0,2.0,1.0);
    bVar1 = Kalman::Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::isIdentity
                      ((Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                       &ukfMatrix.
                        super_UnscentedKalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.gamma)
    ;
    testing::AssertionResult::AssertionResult((AssertionResult *)local_230,bVar1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
    if (!bVar1) {
      testing::Message::Message(&local_238);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_260,(internal *)local_230,(AssertionResult *)"ukfMatrix.S.isIdentity()",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                 ,0x12,pcVar2);
      testing::internal::AssertHelper::operator=(&local_240,&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      testing::Message::~Message(&local_238);
    }
    ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._41_3_ = 0;
    ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
    if (ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
        super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
        super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._40_4_ == 0) {
      ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
      super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
      super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized = false;
      ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
      super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
      super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._41_3_ = 0;
    }
    Kalman::SquareRootUnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::
    ~SquareRootUnscentedKalmanFilter
              ((SquareRootUnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
               &gtest_ar__1.message_);
  }
  Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
  ~SquareRootUnscentedKalmanFilter
            ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)
             ((long)&gtest_ar_.message_.ptr_ + 4));
  return;
}

Assistant:

TEST(SquareRootUnscentedKalmanFilter, init) {
    auto ukf = SquareRootUnscentedKalmanFilter<Vector<T, 3>>(1,2,1);
    ASSERT_TRUE(ukf.S.isIdentity()); // S should be identity

    // Same as above, but with general matrix type instead of vector
    auto ukfMatrix = SquareRootUnscentedKalmanFilter<Matrix<T, 3, 1>>(1,2,1);
    ASSERT_TRUE(ukfMatrix.S.isIdentity()); // S should be identity
}